

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-dda-dump.cpp
# Opt level: O2

void __thiscall Dumper::printName(Dumper *this,RWNode *node)

{
  _Alloc_hider _Var1;
  char cVar2;
  uint uVar3;
  int iVar4;
  Value *V;
  raw_ostream *prVar5;
  iterator iVar6;
  char *__format;
  int i;
  long lVar7;
  __string_type str;
  string local_250;
  raw_os_ostream ro;
  string nm;
  StringRef local_1c8;
  string local_1b8 [32];
  ostringstream ostr;
  
  if (node == (RWNode *)0x0) {
    __format = "nullptr";
LAB_0011ed08:
    printf(__format);
    return;
  }
  if (dg::dda::UNKNOWN_MEMORY == node) {
    __format = "unknown mem";
    goto LAB_0011ed08;
  }
  nm._M_dataplus._M_p = (pointer)&nm.field_2;
  nm._M_string_length = 0;
  nm.field_2._M_local_buf[0] = '\0';
  V = (Value *)dg::dda::LLVMDataDependenceAnalysis::getValue((RWNode *)this->DDA);
  if (V == (Value *)0x0) {
    printRWNodeType(*(RWNodeType *)(node + 0x90));
    printId(node);
    goto LAB_0011ef86;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ostr);
  _ro = std::__throw_length_error;
  if (dump_c_lines[0x80] == '\x01') {
    if (0x1a < (byte)V[0x10]) {
      if (*(long *)(V + 0x30) == 0) {
        str._M_dataplus._M_p = (pointer)V;
        iVar6 = std::
                _Rb_tree<const_llvm::Value_*,_std::pair<const_llvm::Value_*const,_CVariableDecl>,_std::_Select1st<std::pair<const_llvm::Value_*const,_CVariableDecl>_>,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_CVariableDecl>_>_>
                ::find(&valuesToVars._M_t,(key_type *)&str);
        if ((_Rb_tree_header *)iVar6._M_node == &valuesToVars._M_t._M_impl.super__Rb_tree_header) {
          llvm::raw_ostream::operator<<((raw_ostream *)&ro,"(no dbg) ");
          goto LAB_0011ed3b;
        }
        prVar5 = (raw_ostream *)
                 llvm::raw_ostream::operator<<
                           ((raw_ostream *)&ro,(ulong)*(uint *)&iVar6._M_node[2]._M_parent);
        prVar5 = llvm::raw_ostream::operator<<(prVar5,":");
        uVar3 = *(uint *)((long)&iVar6._M_node[2]._M_parent + 4);
      }
      else {
        uVar3 = llvm::DebugLoc::getLine();
        prVar5 = (raw_ostream *)llvm::raw_ostream::operator<<((raw_ostream *)&ro,(ulong)uVar3);
        prVar5 = llvm::raw_ostream::operator<<(prVar5,":");
        uVar3 = llvm::DebugLoc::getCol();
      }
      llvm::raw_ostream::operator<<(prVar5,(ulong)uVar3);
    }
  }
  else {
LAB_0011ed3b:
    llvm::operator<<((raw_ostream *)&ro,V);
  }
  llvm::raw_ostream::flush((raw_ostream *)&ro);
  std::__cxx11::stringbuf::str();
  _Var1 = str._M_dataplus;
  lVar7 = -1;
  do {
    iVar4 = isspace((int)_Var1._M_p[lVar7 + 1]);
    lVar7 = lVar7 + 1;
  } while (iVar4 != 0);
  std::__cxx11::string::rfind((char *)&str,0x121587);
  if (lVar7 != 0) {
    std::__cxx11::string::substr((ulong)local_1b8,(ulong)&str);
    std::__cxx11::string::operator=((string *)&str,local_1b8);
    std::__cxx11::string::_M_dispose();
  }
  if ((dump_c_lines[0x80] == '\x01') || ((byte)V[0x10] < 0x1b)) {
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)str._M_dataplus._M_p == &str.field_2) {
      local_250.field_2._8_8_ = str.field_2._8_8_;
    }
    else {
      local_250._M_dataplus._M_p = str._M_dataplus._M_p;
    }
    local_250._M_string_length = str._M_string_length;
    str._M_string_length = 0;
    str.field_2._M_local_buf[0] = '\0';
    str._M_dataplus._M_p = (pointer)&str.field_2;
  }
  else {
    local_1c8 = (StringRef)llvm::Value::getName();
    llvm::StringRef::str_abi_cxx11_(&local_250,&local_1c8);
    if (0xf < local_250._M_string_length) {
      std::__cxx11::string::substr((ulong)local_1b8,(ulong)&local_250);
      std::__cxx11::string::operator=((string *)&local_250,local_1b8);
      std::__cxx11::string::_M_dispose();
    }
    std::__cxx11::string::append((char *)&local_250);
    std::__cxx11::string::append((string *)&local_250);
  }
  std::__cxx11::string::_M_dispose();
  llvm::raw_os_ostream::~raw_os_ostream(&ro);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ostr);
  std::__cxx11::string::operator=((string *)&nm,(string *)&local_250);
  std::__cxx11::string::_M_dispose();
  _Var1 = nm._M_dataplus;
  for (lVar7 = 0; cVar2 = _Var1._M_p[lVar7], cVar2 != '\0'; lVar7 = lVar7 + 1) {
    if (lVar7 == 0x46) {
      printf(" ...");
      break;
    }
    if (cVar2 == '\"') {
      putchar(0x5c);
      cVar2 = _Var1._M_p[lVar7];
    }
    putchar((int)cVar2);
  }
LAB_0011ef86:
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void printName(const RWNode *node) {
        if (node == nullptr) {
            printf("nullptr");
            return;
        }

        if (node == UNKNOWN_MEMORY) {
            printf("unknown mem");
            return;
        }

        const char *name = nullptr;

        std::string nm;
        if (!name) {
            const auto *val = DDA->getValue(node);
            if (!val) {
                printRWNodeType(node->getType());
                printId(node);
                return;
            }

            nm = getInstName(val);
            name = nm.c_str();
        }

        // escape the " character
        for (int i = 0; name[i] != '\0'; ++i) {
            // crop long names
            if (i >= 70) {
                printf(" ...");
                break;
            }

            if (name[i] == '"')
                putchar('\\');

            putchar(name[i]);
        }
    }